

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

void __thiscall hgdb::json::SymbolTable::SymbolTable(SymbolTable *this,string *framework_name)

{
  _Rb_tree_header *p_Var1;
  
  std::__cxx11::string::string((string *)this,(string *)framework_name);
  (this->top_names_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->top_names_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->top_names_)._M_t._M_impl.super__Rb_tree_header;
  (this->top_names_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->top_names_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->top_names_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->modules_).
  super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->modules_).
  super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->modules_).
  super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->variables_).super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->variables_).super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->variables_).super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->reorder_ = true;
  return;
}

Assistant:

explicit SymbolTable(std::string framework_name) : framework_name_(std::move(framework_name)) {}